

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aq_cyclicrefresh.c
# Opt level: O0

int av1_cyclic_refresh_rc_bits_per_mb(AV1_COMP *cpi,int i,double correction_factor)

{
  int iVar1;
  double dVar2;
  undefined4 in_ESI;
  long in_RDI;
  undefined8 in_XMM0_Qa;
  double dVar3;
  double dVar4;
  int accurate_estimate;
  int deltaq;
  double weight_segment;
  int num4x4bl;
  int bits_per_mb;
  CYCLIC_REFRESH *cr;
  AV1_COMMON *cm;
  double in_stack_ffffffffffffffa0;
  undefined8 in_stack_ffffffffffffffa8;
  AV1_COMP *in_stack_ffffffffffffffb0;
  double local_38;
  int *piVar5;
  int accurate_estimate_00;
  undefined4 in_stack_fffffffffffffff0;
  
  dVar2 = (double)(in_RDI + 0x3bf80);
  piVar5 = *(int **)(in_RDI + 0x712a8);
  iVar1 = *(int *)(in_RDI + 0x3c190) << 4;
  local_38 = (double)(piVar5[6] + piVar5[7] + piVar5[8] >> 1) / (double)iVar1;
  if (*(int *)(in_RDI + 0x60870) != 0) {
    local_38 = (double)(piVar5[6] +
                        (*piVar5 * *(int *)(in_RDI + 0x3c194) * *(int *)(in_RDI + 0x3c198)) / 100 >>
                       1) / (double)iVar1;
  }
  compute_deltaq(in_stack_ffffffffffffffb0,(int)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
                 in_stack_ffffffffffffffa0);
  dVar3 = 1.0 - local_38;
  accurate_estimate_00 = (int)((ulong)piVar5 >> 0x20);
  iVar1 = av1_rc_bits_per_mb((AV1_COMP *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                             (FRAME_TYPE)((ulong)in_XMM0_Qa >> 0x38),(int)in_XMM0_Qa,dVar2,
                             accurate_estimate_00);
  dVar4 = (double)iVar1;
  iVar1 = av1_rc_bits_per_mb((AV1_COMP *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                             (FRAME_TYPE)((ulong)in_XMM0_Qa >> 0x38),(int)in_XMM0_Qa,dVar2,
                             accurate_estimate_00);
  dVar2 = round(dVar3 * dVar4 + local_38 * (double)iVar1);
  return (int)dVar2;
}

Assistant:

int av1_cyclic_refresh_rc_bits_per_mb(const AV1_COMP *cpi, int i,
                                      double correction_factor) {
  const AV1_COMMON *const cm = &cpi->common;
  CYCLIC_REFRESH *const cr = cpi->cyclic_refresh;
  int bits_per_mb;
  int num4x4bl = cm->mi_params.MBs << 4;
  // Weight for segment prior to encoding: take the average of the target
  // number for the frame to be encoded and the actual from the previous frame.
  double weight_segment =
      (double)((cr->target_num_seg_blocks + cr->actual_num_seg1_blocks +
                cr->actual_num_seg2_blocks) >>
               1) /
      num4x4bl;
  if (cpi->rc.rtc_external_ratectrl) {
    weight_segment = (double)((cr->target_num_seg_blocks +
                               cr->percent_refresh * cm->mi_params.mi_rows *
                                   cm->mi_params.mi_cols / 100) >>
                              1) /
                     num4x4bl;
  }
  // Compute delta-q corresponding to qindex i.
  int deltaq = compute_deltaq(cpi, i, cr->rate_ratio_qdelta);
  const int accurate_estimate = cpi->sf.hl_sf.accurate_bit_estimate;
  // Take segment weighted average for bits per mb.
  bits_per_mb = (int)round(
      (1.0 - weight_segment) *
          av1_rc_bits_per_mb(cpi, cm->current_frame.frame_type, i,
                             correction_factor, accurate_estimate) +
      weight_segment * av1_rc_bits_per_mb(cpi, cm->current_frame.frame_type,
                                          i + deltaq, correction_factor,
                                          accurate_estimate));
  return bits_per_mb;
}